

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

char * byteutil_readUTF(uint8_t **buffer,size_t *byteLen)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  LOGGER_LOG p_Var3;
  size_t local_50;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t malloc_size;
  uint16_t stringLen;
  uint8_t *bufferInitial;
  char *result;
  size_t *byteLen_local;
  uint8_t **buffer_local;
  
  bufferInitial = (uint8_t *)0x0;
  puVar1 = *buffer;
  uVar2 = byteutil_read_uint16(buffer,*byteLen);
  if ((uVar2 == 0) || ((uint8_t *)*byteLen < *buffer + ((ulong)uVar2 - (long)puVar1))) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                ,"byteutil_readUTF",0xbd,1,"String passed not a valid UTF.");
    }
  }
  else {
    if ((ulong)uVar2 < 0xfffffffffffffffe) {
      local_50 = (ulong)uVar2 + 1;
    }
    else {
      local_50 = 0xffffffffffffffff;
    }
    if ((local_50 == 0xffffffffffffffff) ||
       (bufferInitial = (uint8_t *)malloc(local_50), bufferInitial == (uint8_t *)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"byteutil_readUTF",0xb8,1,"Cannot alloc memory, size:%zu",local_50);
      }
    }
    else {
      memcpy(bufferInitial,*buffer,(ulong)uVar2);
      bufferInitial[uVar2] = '\0';
      *buffer = *buffer + (int)(uint)uVar2;
      *byteLen = (ulong)uVar2;
    }
  }
  return (char *)bufferInitial;
}

Assistant:

static char* byteutil_readUTF(uint8_t** buffer, size_t* byteLen)
{
    char* result = NULL;

    const uint8_t* bufferInitial = *buffer;
    // Get the length of the string
    uint16_t stringLen = byteutil_read_uint16(buffer, *byteLen);
    // Verify that byteutil_read_uint16 succeeded (by stringLen>0) and that we're
    // not being asked to read a string longer than buffer passed in.
    if ((stringLen > 0) && ((size_t)(stringLen + (*buffer - bufferInitial)) <= *byteLen))
    {
        size_t malloc_size = safe_add_size_t((size_t)stringLen, 1);
        if (malloc_size != SIZE_MAX &&
            (result = (char*)malloc(malloc_size)) != NULL)
        {
            (void)memcpy(result, *buffer, stringLen);
            result[stringLen] = '\0';
            *buffer += stringLen;
            *byteLen = stringLen;
         }
        else
        {
            LogError("Cannot alloc memory, size:%zu", malloc_size);
        }
    }
    else
    {
        LogError("String passed not a valid UTF.");
    }

    return result;
}